

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O3

void __thiscall ZmqContextManager::ZmqContextManager(ZmqContextManager *this,string *contextName)

{
  pointer pcVar1;
  context_t *this_00;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (contextName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + contextName->_M_string_length);
  this_00 = (context_t *)operator_new(8);
  zmq::context_t::context_t(this_00,1,0x1000);
  (this->zcontext)._M_t.super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>.
  _M_t.super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
  super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl = this_00;
  (this->leakOnDelete)._M_base._M_i = true;
  return;
}

Assistant:

ZmqContextManager::ZmqContextManager(const std::string& contextName):
    name(contextName), zcontext(std::make_unique<zmq::context_t>(1, 4096))
{
}